

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDErrorReporter.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSDErrorReporter::emitError
          (XSDErrorReporter *this,uint toEmit,XMLCh *msgDomain,Locator *aLocator)

{
  XMLErrorReporter *pXVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint *puVar7;
  ErrTypes local_844;
  long *plStack_840;
  ErrTypes errType;
  XMLMsgLoader *msgLoader;
  XMLCh errText [1024];
  XMLSize_t msgSize;
  Locator *aLocator_local;
  XMLCh *msgDomain_local;
  uint toEmit_local;
  XSDErrorReporter *this_local;
  
  errText[0x3fc] = L'Ͽ';
  errText[0x3fd] = L'\0';
  errText[0x3fe] = L'\0';
  errText[0x3ff] = L'\0';
  plStack_840 = gErrMsgLoader;
  local_844 = XMLErrs::errorType(toEmit);
  bVar2 = XMLString::equals(msgDomain,(XMLCh *)XMLUni::fgValidityDomain);
  if (bVar2) {
    local_844 = XMLValid::errorType(toEmit);
    plStack_840 = gValidMsgLoader;
  }
  (**(code **)(*plStack_840 + 0x10))(plStack_840,toEmit,&msgLoader,0x3ff);
  if (this->fErrorReporter != (XMLErrorReporter *)0x0) {
    pXVar1 = this->fErrorReporter;
    iVar3 = (*aLocator->_vptr_Locator[3])();
    iVar4 = (*aLocator->_vptr_Locator[2])();
    iVar5 = (*aLocator->_vptr_Locator[4])();
    iVar6 = (*aLocator->_vptr_Locator[5])();
    (*pXVar1->_vptr_XMLErrorReporter[2])
              (pXVar1,(ulong)toEmit,msgDomain,(ulong)local_844,&msgLoader,
               CONCAT44(extraout_var,iVar3),CONCAT44(extraout_var_00,iVar4),
               CONCAT44(extraout_var_01,iVar5),CONCAT44(extraout_var_02,iVar6));
  }
  if ((local_844 == ErrType_Fatal) && ((this->fExitOnFirstFatal & 1U) != 0)) {
    puVar7 = (uint *)__cxa_allocate_exception(4);
    *puVar7 = toEmit;
    __cxa_throw(puVar7,&XMLErrs::Codes::typeinfo,0);
  }
  return;
}

Assistant:

void XSDErrorReporter::emitError(const unsigned int toEmit,
                                 const XMLCh* const msgDomain,
                                 const Locator* const aLocator)
{
    // Bump the error count if it is not a warning
//    if (XMLErrs::errorType(toEmit) != XMLErrorReporter::ErrType_Warning)
//        incrementErrorCount();

    //
    //  Load the message into alocal and replace any tokens found in
    //  the text.
    //
    const XMLSize_t msgSize = 1023;
    XMLCh errText[msgSize + 1];
    XMLMsgLoader* msgLoader = gErrMsgLoader;
    XMLErrorReporter::ErrTypes errType = XMLErrs::errorType((XMLErrs::Codes) toEmit);

    if (XMLString::equals(msgDomain, XMLUni::fgValidityDomain)) {

        errType = XMLValid::errorType((XMLValid::Codes) toEmit);
        msgLoader = gValidMsgLoader;
    }

    if (!msgLoader->loadMsg(toEmit, errText, msgSize))
    {
                // <TBD> Should probably load a default message here
    }

    if (fErrorReporter)
        fErrorReporter->error(toEmit, msgDomain, errType, errText, aLocator->getSystemId(),
                              aLocator->getPublicId(), aLocator->getLineNumber(),
                              aLocator->getColumnNumber());

    // Bail out if its fatal an we are to give up on the first fatal error
    if (errType == XMLErrorReporter::ErrType_Fatal && fExitOnFirstFatal)
        throw (XMLErrs::Codes) toEmit;
}